

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Functional::VertexIDCase::init(VertexIDCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  RenderContext *renderCtx;
  pointer pVVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  ShaderProgram *pSVar4;
  ulong uVar5;
  NotSupportedError *pNVar6;
  TestError *this_01;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  float w;
  float fVar13;
  float h;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ProgramSources sources;
  value_type local_148;
  value_type local_128;
  long local_108;
  undefined1 local_100 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar8 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((int)uVar8 < 0x20) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Too small render target","");
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_100);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar8 = uVar8 >> 5;
  uVar10 = 4;
  if (uVar8 < 4) {
    uVar10 = uVar8;
  }
  iVar11 = (((int)(4 / (ulong)uVar8) + 1) - (uint)((int)(4 % (ulong)uVar8) == 0)) * 0x20;
  local_108 = CONCAT44(extraout_var,iVar2);
  if (iVar11 <= pRVar3->m_height) {
    pSVar4 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,
               "#version 300 es\nin highp vec4 a_position;\nout mediump vec4 v_color;\nuniform highp vec4 u_colors[24];\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = u_colors[gl_VertexID];\n}\n"
               ,"");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,
               "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
               ,"");
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_100,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100,&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_e8,&local_148);
    glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,(ProgramSources *)local_100);
    this->m_program = pSVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar12 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_program);
    lVar12 = local_108;
    pSVar4 = this->m_program;
    if ((pSVar4->m_program).m_info.linkOk != false) {
      (**(code **)(local_108 + 0x6c8))(1,&this->m_positionBuffer);
      (**(code **)(lVar12 + 0x6c8))(1,&this->m_elementBuffer);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&this->m_colors,0x18);
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1->m_data[0] = 0.0;
      pVVar1->m_data[1] = 0.0;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[1].m_data[0] = 0.5;
      pVVar1[1].m_data[1] = 1.0;
      pVVar1[1].m_data[2] = 0.5;
      pVVar1[1].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[2].m_data[0] = 0.0;
      pVVar1[2].m_data[1] = 0.5;
      *(undefined1 **)(pVVar1[2].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[3].m_data[0] = 0.0;
      pVVar1[3].m_data[1] = 1.0;
      pVVar1[3].m_data[2] = 0.0;
      pVVar1[3].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[4].m_data[0] = 0.0;
      pVVar1[4].m_data[1] = 1.0;
      *(undefined1 **)(pVVar1[4].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[5].m_data[0] = 0.5;
      pVVar1[5].m_data[1] = 0.0;
      pVVar1[5].m_data[2] = 0.0;
      pVVar1[5].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[6].m_data[0] = 0.5;
      pVVar1[6].m_data[1] = 0.0;
      *(undefined1 **)(pVVar1[6].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[7].m_data[0] = 0.5;
      pVVar1[7].m_data[1] = 0.0;
      pVVar1[7].m_data[2] = 0.5;
      pVVar1[7].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[8].m_data[0] = 1.0;
      pVVar1[8].m_data[1] = 0.0;
      pVVar1[8].m_data[2] = 0.0;
      pVVar1[8].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[9].m_data[0] = 0.5;
      pVVar1[9].m_data[1] = 1.0;
      pVVar1[9].m_data[2] = 0.0;
      pVVar1[9].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[10].m_data[0] = 0.0;
      pVVar1[10].m_data[1] = 0.5;
      pVVar1[10].m_data[2] = 0.0;
      pVVar1[10].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0xb].m_data[0] = 0.5;
      pVVar1[0xb].m_data[1] = 1.0;
      *(undefined1 **)(pVVar1[0xb].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0xc].m_data[0] = 0.0;
      pVVar1[0xc].m_data[1] = 0.0;
      *(undefined1 **)(pVVar1[0xc].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0xd].m_data[0] = 1.0;
      pVVar1[0xd].m_data[1] = 0.0;
      pVVar1[0xd].m_data[2] = 0.5;
      pVVar1[0xd].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0xe].m_data[0] = 0.0;
      pVVar1[0xe].m_data[1] = 0.5;
      pVVar1[0xe].m_data[2] = 0.5;
      pVVar1[0xe].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined1 **)pVVar1[0xf].m_data = &DAT_3f8000003f800000;
      pVVar1[0xf].m_data[2] = 0.5;
      pVVar1[0xf].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x10].m_data[0] = 1.0;
      pVVar1[0x10].m_data[1] = 0.0;
      *(undefined1 **)(pVVar1[0x10].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x11].m_data[0] = 1.0;
      pVVar1[0x11].m_data[1] = 0.5;
      pVVar1[0x11].m_data[2] = 0.0;
      pVVar1[0x11].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x12].m_data[0] = 0.0;
      pVVar1[0x12].m_data[1] = 1.0;
      pVVar1[0x12].m_data[2] = 0.5;
      pVVar1[0x12].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x13].m_data[0] = 1.0;
      pVVar1[0x13].m_data[1] = 0.5;
      *(undefined1 **)(pVVar1[0x13].m_data + 2) = &DAT_3f8000003f800000;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined1 **)pVVar1[0x14].m_data = &DAT_3f8000003f800000;
      pVVar1[0x14].m_data[2] = 0.0;
      pVVar1[0x14].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x15].m_data[0] = 1.0;
      pVVar1[0x15].m_data[1] = 0.5;
      pVVar1[0x15].m_data[2] = 0.5;
      pVVar1[0x15].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[0x16].m_data[0] = 0.0;
      pVVar1[0x16].m_data[1] = 0.0;
      pVVar1[0x16].m_data[2] = 0.5;
      pVVar1[0x16].m_data[3] = 1.0;
      pVVar1 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined1 **)pVVar1[0x17].m_data = &DAT_3f8000003f800000;
      *(undefined1 **)(pVVar1[0x17].m_data + 2) = &DAT_3f8000003f800000;
      this_00 = &this->m_positions;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (this_00,0x18);
      fVar14 = 64.0 / (float)iVar11;
      fVar13 = 64.0 / (float)(int)(uVar10 << 5);
      uVar7 = 0xfffffffffffffffd;
      bVar9 = false;
      lVar12 = 0;
      do {
        uVar5 = (ulong)((int)uVar7 + 3) / 6;
        fVar15 = (float)(int)(uVar5 % (ulong)uVar8) * fVar13 + -1.0;
        fVar16 = (float)(int)(uVar5 / uVar8) * fVar14 + -1.0;
        if (bVar9) {
          fVar17 = fVar13 + fVar15;
          pVVar1 = (this_00->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(float *)((long)pVVar1->m_data + lVar12) = fVar17;
          *(float *)((long)pVVar1->m_data + lVar12 + 4) = fVar14 + fVar16;
          *(undefined8 *)((long)pVVar1->m_data + lVar12 + 8) = 0x3f80000000000000;
        }
        else {
          pVVar1 = (this_00->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(float *)((long)pVVar1->m_data + lVar12) = fVar15;
          *(float *)((long)pVVar1->m_data + lVar12 + 4) = fVar16;
          *(undefined8 *)((long)pVVar1->m_data + lVar12 + 8) = 0x3f80000000000000;
          fVar16 = fVar16 + fVar14;
          fVar17 = fVar15;
          fVar15 = fVar13 + fVar15;
        }
        pVVar1 = (this_00->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)pVVar1[1].m_data + lVar12) = fVar15;
        *(float *)((long)pVVar1[1].m_data + lVar12 + 4) = fVar16;
        *(undefined8 *)((long)pVVar1[1].m_data + lVar12 + 8) = 0x3f80000000000000;
        pVVar1 = (this_00->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)pVVar1[2].m_data + lVar12) = fVar17;
        *(float *)((long)pVVar1[2].m_data + lVar12 + 4) = fVar16;
        *(undefined8 *)((long)pVVar1[2].m_data + lVar12 + 8) = 0x3f80000000000000;
        lVar12 = lVar12 + 0x30;
        uVar7 = uVar7 + 3;
        bVar9 = (bool)(bVar9 ^ 1);
      } while (uVar7 < 0x15);
      this->m_viewportW = uVar10 << 5;
      this->m_viewportH = iVar11;
      this->m_iterNdx = 0;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return extraout_EAX;
    }
    if (pSVar4 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar4);
      operator_delete(pSVar4,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Compile failed","");
    tcu::TestError::TestError(this_01,(string *)local_100);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Too small render target","");
  tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_100);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexIDCase::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();

	const int				quadWidth	= 32;
	const int				quadHeight	= 32;

	if (width < quadWidth)
		throw tcu::NotSupportedError("Too small render target");

	const int				maxQuadsX	= width/quadWidth;
	const int				numVertices	= MAX_VERTICES;

	const int				numQuads	= numVertices/6 + (numVertices%6 != 0 ? 1 : 0);
	const int				viewportW	= de::min(numQuads, maxQuadsX)*quadWidth;
	const int				viewportH	= (numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0))*quadHeight;

	if (viewportH > height)
		throw tcu::NotSupportedError("Too small render target");

	DE_ASSERT(viewportW <= width && viewportH <= height);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"out mediump vec4 v_color;\n"
		"uniform highp vec4 u_colors[24];\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = u_colors[gl_VertexID];\n"
		"}\n",

		"#version 300 es\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n"));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}

	gl.genBuffers(1, &m_positionBuffer);
	gl.genBuffers(1, &m_elementBuffer);

	// Set colors (in dynamic memory to save static data space).
	m_colors.resize(numVertices);
	m_colors[ 0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 1] = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);
	m_colors[ 2] = tcu::Vec4(0.0f, 0.5f, 1.0f, 1.0f);
	m_colors[ 3] = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	m_colors[ 4] = tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f);
	m_colors[ 5] = tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f);
	m_colors[ 6] = tcu::Vec4(0.5f, 0.0f, 1.0f, 1.0f);
	m_colors[ 7] = tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f);
	m_colors[ 8] = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 9] = tcu::Vec4(0.5f, 1.0f, 0.0f, 1.0f);
	m_colors[10] = tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f);
	m_colors[11] = tcu::Vec4(0.5f, 1.0f, 1.0f, 1.0f);
	m_colors[12] = tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	m_colors[13] = tcu::Vec4(1.0f, 0.0f, 0.5f, 1.0f);
	m_colors[14] = tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f);
	m_colors[15] = tcu::Vec4(1.0f, 1.0f, 0.5f, 1.0f);
	m_colors[16] = tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f);
	m_colors[17] = tcu::Vec4(1.0f, 0.5f, 0.0f, 1.0f);
	m_colors[18] = tcu::Vec4(0.0f, 1.0f, 0.5f, 1.0f);
	m_colors[19] = tcu::Vec4(1.0f, 0.5f, 1.0f, 1.0f);
	m_colors[20] = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	m_colors[21] = tcu::Vec4(1.0f, 0.5f, 0.5f, 1.0f);
	m_colors[22] = tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f);
	m_colors[23] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

	// Compute positions.
	m_positions.resize(numVertices);
	DE_ASSERT(numVertices%3 == 0);
	for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx += 3)
	{
		const float	h			= 2.0f * float(quadHeight)/float(viewportH);
		const float	w			= 2.0f * float(quadWidth)/float(viewportW);

		const int	triNdx		= vtxNdx/3;
		const int	quadNdx		= triNdx/2;
		const int	quadY		= quadNdx/maxQuadsX;
		const int	quadX		= quadNdx%maxQuadsX;

		const float	x0			= -1.0f + float(quadX)*w;
		const float	y0			= -1.0f + float(quadY)*h;

		if (triNdx%2 == 0)
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0,   y0+h, 0.0f, 1.0f);
		}
		else
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0+w, y0,   0.0f, 1.0f);
		}
	}

	m_viewportW	= viewportW;
	m_viewportH	= viewportH;
	m_iterNdx	= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}